

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::insertfile(Fl_Text_Buffer *this,char *file,int pos,int buflen)

{
  FILE *__stream;
  wchar_t wVar1;
  uint ucs;
  wchar_t wVar2;
  char *text;
  size_t sVar3;
  int iVar4;
  char *__dest;
  char *p;
  char *local_d8;
  wchar_t local_cc;
  FILE *local_c8;
  Fl_Text_Buffer *local_c0;
  char multibyte [5];
  char line [100];
  undefined1 local_34 [4];
  
  local_c8 = (FILE *)fl_fopen(file,"r");
  if (local_c8 == (FILE *)0x0) {
    return 1;
  }
  text = (char *)operator_new__((long)(buflen + 1));
  this->input_file_was_transcoded = 0;
  local_d8 = line;
  local_c0 = this;
  do {
    p = line;
    __dest = text;
    while (__dest < text + buflen) {
      if (local_d8 <= p) {
        sVar3 = fread(line,1,100,local_c8);
        local_d8 = line + (int)sVar3;
        p = line;
        if ((int)sVar3 == 0) goto LAB_001cc5be;
      }
      wVar1 = fl_utf8len1(*p);
      if (local_d8 < p + wVar1) {
        memmove(line,p,(long)local_d8 - (long)p);
        local_d8 = local_d8 + (long)(line + -(long)p);
        sVar3 = fread(local_d8,1,(size_t)(local_34 + -(long)local_d8),local_c8);
        local_d8 = local_d8 + (int)sVar3;
        p = line;
        sVar3 = (long)local_d8 - (long)p;
        if ((long)sVar3 < (long)wVar1) goto LAB_001cc5ad;
      }
      for (; L'\0' < wVar1; wVar1 = wVar1 - local_cc) {
        ucs = fl_utf8decode(p,p + (uint)wVar1,&local_cc);
        wVar2 = fl_utf8encode(ucs,multibyte);
        if ((local_cc != wVar1) || (wVar2 != wVar1)) {
          local_c0->input_file_was_transcoded = 1;
        }
        if (text + buflen < __dest + wVar2) {
          sVar3 = (long)local_d8 - (long)p;
          goto LAB_001cc5ad;
        }
        memcpy(__dest,multibyte,(long)wVar2);
        p = p + local_cc;
        __dest = __dest + wVar2;
      }
    }
    sVar3 = (long)local_d8 - (long)p;
LAB_001cc5ad:
    memmove(line,p,sVar3);
    local_d8 = local_d8 + ((long)line - (long)p);
LAB_001cc5be:
    __stream = local_c8;
    iVar4 = (int)__dest - (int)text;
    if (iVar4 == 0) {
      iVar4 = ferror(local_c8);
      fclose(__stream);
      operator_delete__(text);
      if (((iVar4 == 0) && (local_c0->input_file_was_transcoded != 0)) &&
         (local_c0->transcoding_warning_action != (_func_void_Fl_Text_Buffer_ptr *)0x0)) {
        (*local_c0->transcoding_warning_action)(local_c0);
      }
      return (uint)(iVar4 != 0) * 2;
    }
    text[iVar4] = '\0';
    insert(local_c0,pos,text);
    pos = pos + iVar4;
  } while( true );
}

Assistant:

int Fl_Text_Buffer::insertfile(const char *file, int pos, int buflen)
{
  FILE *fp;
  if (!(fp = fl_fopen(file, "r")))
    return 1;
  char *buffer = new char[buflen + 1];  
  char *endline, line[100];
  int l;
  input_file_was_transcoded = false;
  endline = line;
  while (true) {
#ifdef EXAMPLE_ENCODING
    // example of 16-bit encoding: UTF-16
    l = general_input_filter(buffer, buflen, 
				  line, sizeof(line), endline, 
				  utf16toucs, // use cp1252toucs to read CP1252-encoded files
				  fp);
    input_file_was_transcoded = true;
#else
    l = utf8_input_filter(buffer, buflen, line, sizeof(line), endline, 
			  fp, &input_file_was_transcoded);
#endif
    if (l == 0) break;
    buffer[l] = 0;
    insert(pos, buffer);
    pos += l;
  }
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  delete[]buffer;
  if ( (!e) && input_file_was_transcoded && transcoding_warning_action) {
    transcoding_warning_action(this);
  }
  return e;
}